

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ures.h
# Opt level: O1

UnicodeString *
icu_63::ures_getUnicodeStringByIndex
          (UnicodeString *__return_storage_ptr__,UResourceBundle *resB,int32_t indexS,
          UErrorCode *status)

{
  int32_t len;
  int32_t local_2c;
  ConstChar16Ptr local_28 [3];
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e6fd8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_2c = 0;
  local_28[0].p_ = ures_getStringByIndex_63(resB,indexS,&local_2c,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::setTo(__return_storage_ptr__,'\x01',local_28,local_2c);
  }
  else {
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString
ures_getUnicodeStringByIndex(const UResourceBundle *resB, int32_t indexS, UErrorCode* status) {
    UnicodeString result;
    int32_t len = 0;
    const UChar* r = ures_getStringByIndex(resB, indexS, &len, status);
    if(U_SUCCESS(*status)) {
        result.setTo(TRUE, r, len);
    } else {
        result.setToBogus();
    }
    return result;
}